

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O2

shared_ptr<pstack::Dwarf::Info> __thiscall pstack::Context::getDwarf(Context *this,string *filename)

{
  bool in_DL;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<pstack::Dwarf::Info> sVar1;
  undefined1 local_30 [16];
  
  getImageForName((Context *)local_30,filename,in_DL);
  getDwarf(this,(sptr *)filename);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_30 + 8));
  sVar1.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<pstack::Dwarf::Info>)
         sVar1.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Dwarf::Info>
Context::getDwarf(const std::string &filename)
{
    return getDwarf(getImageForName(filename));
}